

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void labelsize_cb(Fl_Value_Input *i,void *v)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  Fl_Widget_Type *q;
  Fl_Type *o;
  int mod;
  int n;
  void *v_local;
  Fl_Value_Input *i_local;
  
  if ((char *)v == "LOAD") {
    o._4_4_ = Fl_Widget::labelsize(current_widget->o);
  }
  else {
    bVar1 = false;
    dVar3 = Fl_Valuator::value(&i->super_Fl_Valuator);
    o._4_4_ = (Fl_Fontsize)dVar3;
    if (o._4_4_ < 1) {
      o._4_4_ = Fl_Widget_Type::default_size;
    }
    for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
        q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
      if (((q->super_Fl_Type).selected != '\0') &&
         (iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) {
        Fl_Widget::labelsize(q->o,o._4_4_);
        Fl_Widget_Type::redraw(q);
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  Fl_Valuator::value(&i->super_Fl_Valuator,(double)o._4_4_);
  return;
}

Assistant:

void labelsize_cb(Fl_Value_Input* i, void *v) {
  int n;
  if (v == LOAD) {
    n = current_widget->o->labelsize();
  } else {
    int mod = 0;
    n = int(i->value());
    if (n <= 0) n = Fl_Widget_Type::default_size;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->labelsize(n);
	q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
  i->value(n);
}